

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::shlI64x2(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *other_00;
  uint uVar1;
  long lVar2;
  Literal *this_00;
  Literal local_98;
  undefined1 local_80 [8];
  LaneArray<2> lanes;
  
  if ((other->type).id == 2) {
    getLanesI64x2((LaneArray<2> *)local_80,this);
    other_00 = &lanes._M_elems[1].type;
    for (lVar2 = 0; lVar2 != 0x30; lVar2 = lVar2 + 0x18) {
      this_00 = (Literal *)(local_80 + lVar2);
      uVar1 = geti32(other);
      lanes._M_elems[1].type.id._0_4_ = uVar1 & 0x3f;
      shl(&local_98,this_00,(Literal *)other_00);
      if (this_00 != &local_98) {
        ~Literal(this_00);
        Literal(this_00,&local_98);
      }
      ~Literal(&local_98);
      ~Literal((Literal *)other_00);
    }
    Literal(__return_storage_ptr__,(LaneArray<2> *)local_80);
    std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)local_80);
    return __return_storage_ptr__;
  }
  __assert_fail("shift.type == Type::i32",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                ,0x851,
                "Literal wasm::shift(const Literal &, const Literal &) [Lanes = 2, IntoLanes = &wasm::Literal::getLanesI64x2, ShiftOp = &wasm::Literal::shl]"
               );
}

Assistant:

Literal Literal::shlI64x2(const Literal& other) const {
  return shift<2, &Literal::getLanesI64x2, &Literal::shl>(*this, other);
}